

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char (*in_stack_fffffffffffffec8) [3];
  undefined1 local_130 [16];
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  local_60[0] = NullSafeStringView(
                                  "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
                                  );
  local_90.piece_._M_str = (char *)**(undefined8 **)(**(long **)this + 8);
  local_90.piece_._M_len = (*(undefined8 **)(**(long **)this + 8))[1];
  local_c0.piece_ = NullSafeStringView("\" must be unique within ");
  local_f0.piece_._M_str = (char *)**(undefined8 **)(this + 8);
  local_f0.piece_._M_len = (*(undefined8 **)(this + 8))[1];
  local_120.piece_ = NullSafeStringView(", not just within \"");
  local_130._0_8_ = ZEXT28(**(ushort **)(**(long **)(this + 0x10) + 8));
  local_130._8_8_ = ~local_130._0_8_ + (long)*(ushort **)(**(long **)(this + 0x10) + 8);
  StrCat<std::basic_string_view<char,std::char_traits<char>>,char[3]>
            (__return_storage_ptr__,(lts_20250127 *)local_60,&local_90,&local_c0,&local_f0,
             &local_120,(AlphaNum *)local_130,
             (basic_string_view<char,_std::char_traits<char>_> *)0x5bba16,in_stack_fffffffffffffec8)
  ;
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}